

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O2

void __thiscall
rank::Rank::Rank(Rank *this,vector<rank::KeyValue,_std::allocator<rank::KeyValue>_> *key_values)

{
  pointer pKVar1;
  KeyValue *kv;
  pointer pKVar2;
  Entry local_40;
  
  (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_entries).super__Vector_base<rank::Entry,_std::allocator<rank::Entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_dirty = true;
  std::vector<rank::Entry,_std::allocator<rank::Entry>_>::reserve
            (&this->_entries,
             (long)(key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pKVar1 = (key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (pKVar2 = (key_values->super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>).
                _M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    local_40._key_value._key = pKVar2->_key;
    local_40._key_value._value = pKVar2->_value;
    local_40._order = 0;
    std::vector<rank::Entry,_std::allocator<rank::Entry>_>::emplace_back<rank::Entry>
              (&this->_entries,&local_40);
  }
  return;
}

Assistant:

Rank::Rank(const std::vector<KeyValue>& key_values) {
        _dirty = true;
        _entries.reserve(key_values.size());
        for (auto &kv: key_values) { _entries.push_back(kv); }
    }